

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

void __thiscall
Test::Assertion::Assertion(Assertion *this,char *fileName,uint32_t lineNum,string *userMsg)

{
  char *__s;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d [20];
  allocator<char> local_29;
  string *local_28;
  string *userMsg_local;
  char *pcStack_18;
  uint32_t lineNum_local;
  char *fileName_local;
  Assertion *this_local;
  
  local_28 = userMsg;
  userMsg_local._4_4_ = lineNum;
  pcStack_18 = fileName;
  fileName_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_29);
  std::allocator<char>::~allocator(&local_29);
  __s = pcStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->file,__s,local_3d);
  std::allocator<char>::~allocator(local_3d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->method,"",&local_3e);
  std::allocator<char>::~allocator(&local_3e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->args,"",&local_3f);
  std::allocator<char>::~allocator(&local_3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->errorMessage,"",&local_40);
  std::allocator<char>::~allocator(&local_40);
  std::__cxx11::string::string((string *)&this->userMessage,local_28);
  this->lineNumber = userMsg_local._4_4_;
  return;
}

Assistant:

Assertion::Assertion(const char *fileName, uint32_t lineNum, const std::string &userMsg)
    : suite(""), file(fileName), method(""), args(""), errorMessage(""), userMessage(userMsg),
      lineNumber(lineNum) {}